

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::EpsCopyOutputStream::EpsCopyOutputStream
          (EpsCopyOutputStream *this,ZeroCopyOutputStream *stream,bool deterministic,uint8 **pp)

{
  uint8 **pp_local;
  bool deterministic_local;
  ZeroCopyOutputStream *stream_local;
  EpsCopyOutputStream *this_local;
  
  this->end_ = this->buffer_;
  this->buffer_end_ = this->buffer_;
  this->stream_ = stream;
  this->had_error_ = false;
  this->aliasing_enabled_ = false;
  this->is_serialization_deterministic_ = deterministic;
  *pp = this->buffer_;
  return;
}

Assistant:

EpsCopyOutputStream(ZeroCopyOutputStream* stream, bool deterministic,
                      uint8** pp)
      : end_(buffer_),
        stream_(stream),
        is_serialization_deterministic_(deterministic) {
    *pp = buffer_;
  }